

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O1

void * parseAttribute(SymbolContext<char> *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__y;
  pointer pcVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  
  __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ctx->values;
  __y = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx->values[1];
  this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)operator_new(0x40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,__x,__y);
  pcVar1 = (__x->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &__x->field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(__x);
  pcVar1 = (__y->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &__y->field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(__y);
  return this;
}

Assistant:

XMLElement& operator=(XMLElement&& old)
    {
        m_name = std::move(old.m_name);
        m_attributes = std::move(old.m_attributes);
        m_body = std::move(old.m_body);
        return *this;
    }